

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O1

void __thiscall OpenMD::LangevinPiston::scaleSimBox(LangevinPiston *this)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  double (*__return_storage_ptr__) [3];
  double dVar3;
  Mat3x3d hmat;
  Mat3x3d local_58;
  
  dVar3 = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt * this->eta);
  if ((dVar3 <= 1.1) && (0.9 <= dVar3)) {
    __return_storage_ptr__ = (double (*) [3])&local_58;
    Snapshot::getHmat((Mat3x3d *)__return_storage_ptr__,
                      (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
    lVar1 = 0;
    do {
      lVar2 = 0;
      do {
        (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->super_RectMatrix<double,_3U,_3U>).
        data_[0][lVar2] =
             (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->super_RectMatrix<double,_3U,_3U>
             ).data_[0][lVar2] * dVar3;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      lVar1 = lVar1 + 1;
      __return_storage_ptr__ = __return_storage_ptr__ + 1;
    } while (lVar1 != 3);
    Snapshot::setHmat((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,
                      &local_58);
    return;
  }
  snprintf(painCave.errMsg,2000,
           "LangevinPiston error: Attempting a Box scaling of more than 10 percent\n check your tauBarostat, as it is probably too small!\n eta = %lf, scaleFactor = %lf\n"
           ,this->eta);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void LangevinPiston::scaleSimBox() {
    RealType scaleFactor;

    // This is from solving the first order equation that defines eta
    scaleFactor = exp(dt * eta);

    if ((scaleFactor > 1.1) || (scaleFactor < 0.9)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LangevinPiston error: Attempting a Box scaling of more than 10 "
               "percent\n"
               " check your tauBarostat, as it is probably too small!\n"
               " eta = %lf, scaleFactor = %lf\n",
               eta, scaleFactor);
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat *= scaleFactor;
      snap->setHmat(hmat);
    }
  }